

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O2

bool __thiscall AABB::Hit(AABB *this,Ray *ray,double tmin,double tmax)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_38 [4];
  double local_18 [3];
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    if (uVar2 == 3) break;
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    auVar6._0_8_ = (this->max_).e[uVar2] - local_18[uVar2];
    auVar6._8_8_ = (this->min_).e[uVar2] - local_18[uVar2];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    auVar9._8_8_ = local_38[uVar2];
    auVar9._0_8_ = local_38[uVar2];
    auVar6 = divpd(auVar6,auVar9);
    dVar5 = auVar6._0_8_;
    dVar7 = auVar6._8_8_;
    uVar1 = (uint)(dVar5 < dVar7);
    auVar10._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
    auVar10._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
    auVar10._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
    dVar8 = (double)(~auVar10._0_8_ & (ulong)dVar7 | (ulong)dVar5 & auVar10._0_8_);
    dVar5 = (double)(~auVar10._8_8_ & (ulong)dVar5 | (ulong)dVar7 & auVar10._8_8_);
    uVar3 = -(ulong)(dVar8 < tmin);
    uVar4 = -(ulong)(tmax < dVar5);
    tmin = (double)((ulong)tmin & uVar3 | ~uVar3 & (ulong)dVar8);
    tmax = (double)((ulong)tmax & uVar4 | ~uVar4 & (ulong)dVar5);
    uVar3 = uVar2 + 1;
  } while (tmin <= tmax);
  return 2 < uVar2;
}

Assistant:

bool Hit(const Ray& ray, double tmin, double tmax) const {
    for (int i = 0; i < 3; i++) {
      double t0 = (min_[i] - ray.origin()[i]) / ray.direction()[i];
      double t1 = (max_[i] - ray.origin()[i]) / ray.direction()[i];
      if (t0 > t1) std::swap(t0, t1);
      tmin = t0 < tmin ? tmin : t0;
      tmax = t1 > tmax ? tmax : t1;
      if (tmax < tmin) return false;
    }
    return true;
  }